

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

Type __thiscall UnifiedRegex::RegexPattern::EnsureTestCache(RegexPattern *this)

{
  RegExpTestCache **ppRVar1;
  JavascriptLibrary *this_00;
  Recycler *pRVar2;
  RegExpTestCache *this_01;
  long in_RSI;
  TrackAllocData local_40;
  RegexPattern *this_local;
  
  this_local = this;
  ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RegExpTestCache__
                      ((WriteBarrierPtr *)(in_RSI + 8));
  if (*ppRVar1 == (RegExpTestCache *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->
                        ((WriteBarrierPtr<Js::JavascriptLibrary> *)(in_RSI + 0x10));
    pRVar2 = Js::JavascriptLibrary::GetRecycler(this_00);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&RegExpTestCache::typeinfo,0x40,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
               ,0x97);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_40);
    this_01 = (RegExpTestCache *)new<Memory::Recycler>(8,pRVar2,0x473830,0);
    memset(this_01,0,8);
    RegExpTestCache::RegExpTestCache(this_01);
    Memory::WriteBarrierPtr<UnifiedRegex::RegExpTestCache>::operator=
              ((WriteBarrierPtr<UnifiedRegex::RegExpTestCache> *)(in_RSI + 8),this_01);
  }
  Memory::WriteBarrierPtr<UnifiedRegex::RegExpTestCache>::WriteBarrierPtr
            ((WriteBarrierPtr<UnifiedRegex::RegExpTestCache> *)this,
             (WriteBarrierPtr<UnifiedRegex::RegExpTestCache> *)(in_RSI + 8));
  return (Type)(RegExpTestCache *)this;
}

Assistant:

RegexPattern::EnsureTestCache()
    {
        if (this->testCache == nullptr)
        {
            this->testCache = RecyclerNewPlusZ(this->library->GetRecycler(), TestCacheSize * sizeof(void*), RegExpTestCache);
        }
        return this->testCache;
    }